

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_add_exten_to_list(nifti1_extension *new_ext,nifti1_extension **list,int new_length)

{
  nifti1_extension *__src;
  nifti1_extension *__dest;
  int iVar1;
  long lVar2;
  
  __src = *list;
  __dest = (nifti1_extension *)malloc((long)new_length << 4);
  *list = __dest;
  if (__dest == (nifti1_extension *)0x0) {
    fprintf(_stderr,"** failed to alloc %d extension structs (%d bytes)\n",(ulong)(uint)new_length,
            (ulong)(uint)(new_length << 4));
    iVar1 = -1;
    if (__src != (nifti1_extension *)0x0) {
      *list = __src;
    }
  }
  else {
    lVar2 = (long)(new_length + -1);
    if (__src != (nifti1_extension *)0x0) {
      memcpy(__dest,__src,lVar2 << 4);
      free(__src);
      __dest = *list;
    }
    iVar1 = new_ext->ecode;
    __dest[lVar2].esize = new_ext->esize;
    __dest[lVar2].ecode = iVar1;
    __dest[lVar2].edata = new_ext->edata;
    iVar1 = 0;
    if (2 < g_opts_0) {
      iVar1 = 0;
      fprintf(_stderr,"+d allocated and appended extension #%d to list\n",(ulong)(uint)new_length);
    }
  }
  return iVar1;
}

Assistant:

static int nifti_add_exten_to_list( nifti1_extension *  new_ext,
                                    nifti1_extension ** list, int new_length )
{
   nifti1_extension * tmplist;

   tmplist = *list;
   *list = (nifti1_extension *)malloc(new_length * sizeof(nifti1_extension));

   /* check for failure first */
   if( ! *list ){
      fprintf(stderr,"** failed to alloc %d extension structs (%d bytes)\n",
              new_length, new_length*(int)sizeof(nifti1_extension));
      if( !tmplist ) return -1;  /* no old list to lose */

      *list = tmplist;  /* reset list to old one */
      return -1;
   }

   /* if an old list exists, copy the pointers and free the list */
   if( tmplist ){
      memcpy(*list, tmplist, (new_length-1)*sizeof(nifti1_extension));
      free(tmplist);
   }

   /* for some reason, I just don't like struct copy... */
   (*list)[new_length-1].esize = new_ext->esize;
   (*list)[new_length-1].ecode = new_ext->ecode;
   (*list)[new_length-1].edata = new_ext->edata;

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d allocated and appended extension #%d to list\n",
              new_length);

   return 0;
}